

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

VkResult Fossilize::CreateShaderModule
                   (VkDevice device,VkShaderModuleCreateInfo *pCreateInfo,
                   VkAllocationCallbacks *pCallbacks,VkShaderModule *pShaderModule)

{
  bool bVar1;
  VkResult VVar2;
  LogLevel LVar3;
  Device *this;
  VkLayerDispatchTable *pVVar4;
  StateRecorder *this_00;
  VkAllocationCallbacks local_b8 [8];
  VkShaderModuleCreateInfo tmpCreateInfo;
  VkShaderModuleIdentifierEXT identifier;
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT identifierCreateInfo;
  VkResult res;
  Device *layer;
  VkShaderModule *pShaderModule_local;
  VkAllocationCallbacks *pCallbacks_local;
  VkShaderModuleCreateInfo *pCreateInfo_local;
  VkDevice device_local;
  
  this = get_device_layer(device);
  *pShaderModule = (VkShaderModule)0x0;
  pVVar4 = Device::getTable(this);
  VVar2 = (*pVVar4->CreateShaderModule)(device,pCreateInfo,pCallbacks,pShaderModule);
  if (VVar2 == VK_SUCCESS) {
    identifier.identifier[0x1c] = 0xb2;
    identifier.identifier[0x1d] = 0xd6;
    identifier.identifier[0x1e] = 0xa1;
    identifier.identifier[0x1f] = ';';
    identifier._52_4_ = 0;
    memset(&tmpCreateInfo.pCode,0,0x38);
    tmpCreateInfo.pCode._0_4_ = 0x3ba1d6b3;
    bVar1 = Device::requiresModuleIdentifiers(this);
    pCallbacks_local = (VkAllocationCallbacks *)pCreateInfo;
    if (bVar1) {
      pVVar4 = Device::getTable(this);
      (*pVVar4->GetShaderModuleIdentifierEXT)
                (device,*pShaderModule,(VkShaderModuleIdentifierEXT *)&tmpCreateInfo.pCode);
      memcpy(local_b8,pCreateInfo,0x28);
      tmpCreateInfo._0_8_ = identifier.identifier + 0x1c;
      pCallbacks_local = local_b8;
    }
    this_00 = Device::getRecorder(this);
    bVar1 = StateRecorder::record_shader_module
                      (this_00,*pShaderModule,(VkShaderModuleCreateInfo *)pCallbacks_local,0);
    if (((!bVar1) && (LVar3 = get_thread_log_level(), (int)LVar3 < 2)) &&
       (bVar1 = Internal::log_thread_callback
                          (LOG_DEFAULT,
                           "Failed to record shader module, usually caused by unsupported pNext.\n")
       , !bVar1)) {
      fprintf(_stderr,
              "Fossilize WARN: Failed to record shader module, usually caused by unsupported pNext.\n"
             );
    }
  }
  return VVar2;
}

Assistant:

static VKAPI_ATTR VkResult VKAPI_CALL CreateShaderModule(VkDevice device, const VkShaderModuleCreateInfo *pCreateInfo,
                                                         const VkAllocationCallbacks *pCallbacks,
                                                         VkShaderModule *pShaderModule)
{
	auto *layer = get_device_layer(device);

	*pShaderModule = VK_NULL_HANDLE;

	auto res = layer->getTable()->CreateShaderModule(device, pCreateInfo, pCallbacks, pShaderModule);

	if (res == VK_SUCCESS)
	{
		// Pass along the module identifier for later reference.
		VkPipelineShaderStageModuleIdentifierCreateInfoEXT identifierCreateInfo =
				{ VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT };
		VkShaderModuleIdentifierEXT identifier =
				{ VK_STRUCTURE_TYPE_SHADER_MODULE_IDENTIFIER_EXT };
		VkShaderModuleCreateInfo tmpCreateInfo;

		if (layer->requiresModuleIdentifiers())
		{
			layer->getTable()->GetShaderModuleIdentifierEXT(device, *pShaderModule, &identifier);
			identifierCreateInfo.pIdentifier = identifier.identifier;
			identifierCreateInfo.identifierSize = identifier.identifierSize;
			tmpCreateInfo = *pCreateInfo;
			identifierCreateInfo.pNext = tmpCreateInfo.pNext;
			tmpCreateInfo.pNext = &identifierCreateInfo;
			pCreateInfo = &tmpCreateInfo;
		}

		if (!layer->getRecorder().record_shader_module(*pShaderModule, *pCreateInfo))
			LOGW_LEVEL("Failed to record shader module, usually caused by unsupported pNext.\n");
	}

	return res;
}